

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ProcessIntersectList(Clipper *this)

{
  IntersectNode *pIVar1;
  IntersectNode *iNode;
  Clipper *this_local;
  
  while (this->m_IntersectNodes != (IntersectNode *)0x0) {
    pIVar1 = this->m_IntersectNodes->next;
    IntersectEdges(this,this->m_IntersectNodes->edge1,this->m_IntersectNodes->edge2,
                   &this->m_IntersectNodes->pt,ipBoth);
    SwapPositionsInAEL(this,this->m_IntersectNodes->edge1,this->m_IntersectNodes->edge2);
    if (this->m_IntersectNodes != (IntersectNode *)0x0) {
      operator_delete(this->m_IntersectNodes,0x28);
    }
    this->m_IntersectNodes = pIVar1;
  }
  return;
}

Assistant:

void Clipper::ProcessIntersectList()
{
  while( m_IntersectNodes )
  {
    IntersectNode* iNode = m_IntersectNodes->next;
    {
      IntersectEdges( m_IntersectNodes->edge1 ,
        m_IntersectNodes->edge2 , m_IntersectNodes->pt, ipBoth );
      SwapPositionsInAEL( m_IntersectNodes->edge1 , m_IntersectNodes->edge2 );
    }
    delete m_IntersectNodes;
    m_IntersectNodes = iNode;
  }
}